

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O3

void make_iconlabel(Fl_Menu_Item *mi,Fl_Image *ic,char *txt)

{
  size_t sVar1;
  char *__dest;
  Fl_Multi_Label *this;
  
  if (ic != (Fl_Image *)0x0) {
    sVar1 = strlen(txt);
    __dest = (char *)operator_new__(sVar1 + 6);
    __dest[0] = ' ';
    __dest[1] = '\0';
    strcat(__dest,txt);
    sVar1 = strlen(__dest);
    builtin_strncpy(__dest + sVar1,"...",4);
    (*ic->_vptr_Fl_Image[6])(ic,mi);
    this = (Fl_Multi_Label *)operator_new(0x18);
    this->labela = (char *)ic;
    this->labelb = __dest;
    this->typea = '\a';
    this->typeb = '\0';
    Fl_Multi_Label::label(this,mi);
    return;
  }
  if (mi->text != txt) {
    mi->text = txt;
  }
  return;
}

Assistant:

static void make_iconlabel( Fl_Menu_Item *mi, Fl_Image *ic, const char *txt )
{
  if (ic) {
    char *t1 = new char[strlen(txt)+6];
    strcpy( t1, " " );
    strcat(t1, txt);
    strcat(t1, "...");
    mi->image( ic );
    Fl_Multi_Label *ml = new Fl_Multi_Label;
    ml->labela = (char*)ic;
    ml->labelb = t1;
    ml->typea = _FL_IMAGE_LABEL;
    ml->typeb = FL_NORMAL_LABEL;
    ml->label( mi );
  }
  else if (txt!=mi->text)
    mi->label(txt);
}